

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::clara::detail::ParserRefImpl<Catch::clara::detail::Arg>::
ParserRefImpl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (ParserRefImpl<Catch::clara::detail::Arg> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ref,string *hint)

{
  pointer pbVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  (this->super_ComposableParserImpl<Catch::clara::detail::Arg>).super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__ParserRefImpl_0017cc28;
  this->m_optionality = Optional;
  ::std::
  make_shared<Catch::clara::detail::BoundValueRef<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
            (&local_28);
  pbVar1 = local_28.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ref).super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           local_28.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->m_ref).super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar1;
  local_28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_28.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  ::std::__cxx11::string::string((string *)&this->m_hint,hint);
  (this->m_description)._M_dataplus._M_p = (pointer)&(this->m_description).field_2;
  (this->m_description)._M_string_length = 0;
  (this->m_description).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

ParserRefImpl( T &ref, std::string const &hint )
        :   m_ref( std::make_shared<BoundValueRef<T>>( ref ) ),
            m_hint( hint )
        {}